

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

bool __thiscall cfd::core::Privkey::IsValid(Privkey *this)

{
  bool bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  Privkey *local_10;
  Privkey *this_local;
  
  local_10 = this;
  ByteData::GetBytes(&local_28,&this->data_);
  bVar1 = IsValid(&local_28);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28);
  return bVar1;
}

Assistant:

bool Privkey::IsValid() const { return IsValid(data_.GetBytes()); }